

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  int iVar5;
  int number;
  vector<int,_std::allocator<int>_> primes;
  string line;
  ifstream stream;
  
  std::ifstream::ifstream((istream *)&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  number = 2;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
  } while (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0);
  iVar5 = 2;
  while( true ) {
    uVar3 = (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (999 < uVar3) break;
    bVar1 = isPrime(&number);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back(&primes,&number);
      iVar5 = number;
    }
    number = iVar5 + 1;
    iVar5 = number;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
  }
  std::ostream::_M_insert<long>((long)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&primes.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
    string line;

    std::vector<int> primes;
    int number = 2;
    while (getline(stream, line)) {
    }

    while (primes.size() < 1000) {
        if (isPrime(number)) {
            primes.push_back(number);
        }
        number++;
    }

    long int sum = 0;
    for (int i = 0; i < primes.size(); i++) {
        sum += primes[i];
    }

    std::cout << sum;
    return 0;
}